

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::IsSpentKey(CWallet *this,CScript *scriptPubKey)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  LegacyScriptPubKeyMan *pLVar4;
  long in_FS_OFFSET;
  CKeyID *keyid;
  vector<CKeyID,_std::allocator<CKeyID>_> *__range2;
  LegacyScriptPubKeyMan *spk_man;
  iterator __end2;
  iterator __begin2;
  PKHash pkh_dest;
  ScriptHash sh_wpkh_dest;
  WitnessV0KeyHash wpkh_dest;
  CTxDestination dest;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  byte in_stack_fffffffffffffd47;
  CWallet *in_stack_fffffffffffffd48;
  SigningProvider *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  int local_250;
  byte local_229;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffd38,
             (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
             in_stack_fffffffffffffd2c,(AnnotatedMixin<std::recursive_mutex> *)0x16fe708);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  bVar2 = ExtractDestination((CScript *)in_stack_fffffffffffffe18,
                             (CTxDestination *)in_stack_fffffffffffffe10);
  if (bVar2) {
    bVar2 = IsAddressPreviouslySpent
                      ((CWallet *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                       in_stack_fffffffffffffd38);
    if (bVar2) {
      local_229 = 1;
    }
    else {
      pLVar4 = GetLegacyScriptPubKeyMan(in_stack_fffffffffffffd48);
      if (pLVar4 != (LegacyScriptPubKeyMan *)0x0) {
        GetAffectedKeys((CScript *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                        in_stack_fffffffffffffd60);
        std::vector<CKeyID,_std::allocator<CKeyID>_>::begin
                  ((vector<CKeyID,_std::allocator<CKeyID>_> *)
                   CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
        std::vector<CKeyID,_std::allocator<CKeyID>_>::end
                  ((vector<CKeyID,_std::allocator<CKeyID>_> *)
                   CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
        while (bVar2 = __gnu_cxx::
                       operator==<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                                 ((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                                   *)in_stack_fffffffffffffd38,
                                  (__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30)),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>::
          operator*((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_> *)
                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          WitnessV0KeyHash::WitnessV0KeyHash
                    ((WitnessV0KeyHash *)
                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     (uint160 *)0x16fe87b);
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::variant<WitnessV0KeyHash&,void,void,WitnessV0KeyHash,void>
                    (in_stack_fffffffffffffd38,
                     (WitnessV0KeyHash *)
                     CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
          bVar3 = IsAddressPreviouslySpent
                            ((CWallet *)
                             CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd38);
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          if ((bVar3 & 1) != 0) {
            local_229 = 1;
            local_250 = 1;
            goto LAB_016feb07;
          }
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::variant<WitnessV0KeyHash&,void,void,WitnessV0KeyHash,void>
                    (in_stack_fffffffffffffd38,
                     (WitnessV0KeyHash *)
                     CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
          GetScriptForDestination
                    ((CTxDestination *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                    );
          ScriptHash::ScriptHash
                    ((ScriptHash *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                     (CScript *)in_stack_fffffffffffffd38);
          CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                           );
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::variant<ScriptHash&,void,void,ScriptHash,void>
                    (in_stack_fffffffffffffd38,
                     (ScriptHash *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
          bVar2 = IsAddressPreviouslySpent
                            ((CWallet *)
                             CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd38);
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          if (bVar2) {
            local_229 = 1;
            local_250 = 1;
            goto LAB_016feb07;
          }
          PKHash::PKHash((PKHash *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         (CKeyID *)0x16fea6f);
          in_stack_fffffffffffffd38 =
               (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)&stack0xfffffffffffffe00;
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::variant<PKHash&,void,void,PKHash,void>
                    (in_stack_fffffffffffffd38,
                     (PKHash *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
          in_stack_fffffffffffffd47 =
               IsAddressPreviouslySpent
                         ((CWallet *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                          in_stack_fffffffffffffd38);
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          if ((in_stack_fffffffffffffd47 & 1) != 0) {
            local_229 = 1;
            local_250 = 1;
            goto LAB_016feb07;
          }
          __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>::
          operator++((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_> *)
                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        }
        local_250 = 2;
LAB_016feb07:
        std::vector<CKeyID,_std::allocator<CKeyID>_>::~vector
                  ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffd38);
        if (local_250 != 2) goto LAB_016feb46;
      }
      local_229 = 0;
    }
  }
  else {
    local_229 = 0;
  }
LAB_016feb46:
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_229 & 1);
}

Assistant:

bool CWallet::IsSpentKey(const CScript& scriptPubKey) const
{
    AssertLockHeld(cs_wallet);
    CTxDestination dest;
    if (!ExtractDestination(scriptPubKey, dest)) {
        return false;
    }
    if (IsAddressPreviouslySpent(dest)) {
        return true;
    }

    if (LegacyScriptPubKeyMan* spk_man = GetLegacyScriptPubKeyMan()) {
        for (const auto& keyid : GetAffectedKeys(scriptPubKey, *spk_man)) {
            WitnessV0KeyHash wpkh_dest(keyid);
            if (IsAddressPreviouslySpent(wpkh_dest)) {
                return true;
            }
            ScriptHash sh_wpkh_dest(GetScriptForDestination(wpkh_dest));
            if (IsAddressPreviouslySpent(sh_wpkh_dest)) {
                return true;
            }
            PKHash pkh_dest(keyid);
            if (IsAddressPreviouslySpent(pkh_dest)) {
                return true;
            }
        }
    }
    return false;
}